

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O0

void __thiscall TriangleFacet::TriangleFacet(TriangleFacet *this,int i0,int i1,int i2)

{
  array<int,_3UL> *this_00;
  reference pvVar1;
  iterator __first;
  iterator __last;
  int i2_local;
  int i1_local;
  int i0_local;
  TriangleFacet *this_local;
  
  this->tet = (Tetrahedron *)0x0;
  this_00 = &this->orderedNodeIndices;
  std::vector<Node_*,_std::allocator<Node_*>_>::vector(&this->sNodes);
  pvVar1 = std::array<int,_3UL>::operator[](this_00,0);
  *pvVar1 = i0;
  pvVar1 = std::array<int,_3UL>::operator[](this_00,1);
  *pvVar1 = i1;
  pvVar1 = std::array<int,_3UL>::operator[](this_00,2);
  *pvVar1 = i2;
  __first = std::array<int,_3UL>::begin(this_00);
  __last = std::array<int,_3UL>::end(this_00);
  std::sort<int*>(__first,__last);
  return;
}

Assistant:

TriangleFacet(int i0, int i1, int i2){
        orderedNodeIndices[0] = i0;
        orderedNodeIndices[1] = i1;
        orderedNodeIndices[2] = i2;
        std::sort(orderedNodeIndices.begin(), orderedNodeIndices.end());
    }